

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::framebufferRenderbuffer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 renderbuffertarget,
          deUint32 renderbuffer)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  bool bVar4;
  Renderbuffer *pRVar5;
  Framebuffer **ppFVar6;
  int iVar7;
  AttachmentPoint point;
  long lVar8;
  int iVar9;
  Attachment *attachment_00;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d00,(ulong)renderbuffertarget,(ulong)renderbuffer);
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d20,(ulong)renderbuffertarget,(ulong)renderbuffer);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar4 = false;
      lVar8 = 0;
    }
    else {
LAB_004e4947:
      lVar8 = 3;
      bVar4 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar8 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_004e4947;
      lVar8 = 2;
    }
    bVar4 = false;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar4)) {
LAB_004e49b5:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  else {
    ppFVar6 = &this->m_readFramebufferBinding;
    if (target == 0x8ca9) {
      ppFVar6 = &this->m_drawFramebufferBinding;
    }
    if (target == 0x8d40) {
      ppFVar6 = &this->m_drawFramebufferBinding;
    }
    pFVar1 = *ppFVar6;
    if (pFVar1 == (Framebuffer *)0x0) {
LAB_004e4a53:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    pFVar2 = this->m_drawFramebufferBinding;
    pFVar3 = this->m_readFramebufferBinding;
    if (renderbuffer == 0) {
      pRVar5 = (Renderbuffer *)0x0;
    }
    else {
      pRVar5 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,renderbuffer);
      if (renderbuffertarget != 0x8d41) goto LAB_004e49b5;
      if (pRVar5 == (Renderbuffer *)0x0) goto LAB_004e4a53;
    }
    attachment_00 = pFVar1->m_attachments + lVar8;
    iVar9 = (uint)(pFVar1 == pFVar3) + (uint)(pFVar1 == pFVar2);
    for (iVar7 = iVar9; iVar7 != 0; iVar7 = iVar7 + -1) {
      releaseFboAttachmentReference(this,attachment_00);
    }
    attachment_00->type = ATTACHMENTTYPE_LAST;
    attachment_00->name = 0;
    pFVar1->m_attachments[lVar8].texTarget = TEXTARGET_LAST;
    pFVar1->m_attachments[lVar8].level = 0;
    pFVar1->m_attachments[lVar8].layer = 0;
    if (pRVar5 != (Renderbuffer *)0x0) {
      attachment_00->type = ATTACHMENTTYPE_RENDERBUFFER;
      pFVar1->m_attachments[lVar8].name = (pRVar5->super_NamedObject).m_name;
      for (; iVar9 != 0; iVar9 = iVar9 + -1) {
        acquireFboAttachmentReference(this,attachment_00);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferRenderbuffer (deUint32 target, deUint32 attachment, deUint32 renderbuffertarget, deUint32 renderbuffer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach both to depth and stencil.
		framebufferRenderbuffer(target, GL_DEPTH_ATTACHMENT,	renderbuffertarget, renderbuffer);
		framebufferRenderbuffer(target, GL_STENCIL_ATTACHMENT,	renderbuffertarget, renderbuffer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Renderbuffer*					rbo				= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (renderbuffer != 0)
		{
			rbo = m_renderbuffers.find(renderbuffer);

			RC_IF_ERROR(renderbuffertarget != GL_RENDERBUFFER,	GL_INVALID_ENUM,		RC_RET_VOID);
			RC_IF_ERROR(!rbo,									GL_INVALID_OPERATION,	RC_RET_VOID);
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (rbo)
		{
			fboAttachment.type	= Framebuffer::ATTACHMENTTYPE_RENDERBUFFER;
			fboAttachment.name	= rbo->getName();

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}